

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManSetValue(Emb_Man_t *p)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = 0;
  iVar2 = 0;
  while (((int)uVar3 < p->nObjData && (piVar1 = p->pObjData, piVar1 != (int *)0x0))) {
    piVar1[(ulong)uVar3 + 4] = iVar2;
    iVar2 = iVar2 + 1;
    uVar3 = piVar1[(ulong)uVar3 + 1] + ((uint)piVar1[uVar3] >> 4) + uVar3 + 5;
  }
  return;
}

Assistant:

void Emb_ManSetValue( Emb_Man_t * p )  
{
    Emb_Obj_t * pObj;
    int i, Counter = 0;
    Emb_ManForEachObj( p, pObj, i )
    {
        pObj->Value = Counter++;
//        if ( pObj->fCi && pObj->nFanins == 0 ) 
//            printf( "CI:  Handle = %8d.  Value = %6d. Fanins = %d.\n", pObj->hHandle, pObj->Value, pObj->nFanins );
    }
}